

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_utils.c
# Opt level: O0

void * reader_worker(void *param)

{
  FileBufSlot *slot_00;
  FileBufSlot *slot;
  RK_U32 eos;
  FileReaderImpl *impl;
  void *param_local;
  
  slot._4_4_ = 0;
  while ((*(int *)((long)param + 0x60) == 0 && slot._4_4_ == 0 &&
         (slot_00 = (FileBufSlot *)(**(code **)((long)param + 0x38))(param),
         slot_00 != (FileBufSlot *)0x0))) {
    add_new_slot((FileReaderImpl *)param,slot_00);
    slot._4_4_ = slot_00->eos;
  }
  return (void *)0x0;
}

Assistant:

static void* reader_worker(void *param)
{
    FileReaderImpl *impl = (FileReaderImpl*)param;
    RK_U32 eos = 0;

    while (!impl->thd_stop && !eos) {
        FileBufSlot *slot = impl->read_func(impl);

        if (NULL == slot)
            break;

        add_new_slot(impl, slot);
        eos = slot->eos;
    }

    return NULL;
}